

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O1

void __thiscall
boost::unordered::detail::foa::
table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
::unchecked_rehash(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>,_std::equal_to<std::basic_string_view<char,_std::char_traits<char>_>_>,_slang::detail::hashing::StackAllocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_slang::ast::(anonymous_namespace)::NonAnsiPortListBuilder::PortInfo>,_704UL,_16UL>_>
                   *this,arrays_type *new_arrays_)

{
  group_type_pointer pgVar1;
  value_type_pointer ppVar2;
  size_t sVar3;
  group_type_pointer pgVar4;
  group_type_pointer pgVar5;
  uint uVar6;
  uint uVar7;
  ushort uVar8;
  char *pcVar9;
  size_t sVar10;
  value_type_pointer ppVar11;
  uint64_t uVar12;
  long lVar13;
  ulong uVar14;
  group_type_pointer pgVar15;
  PortInfo *pPVar16;
  PortInfo *pPVar17;
  ulong uVar18;
  long lVar19;
  uint uVar20;
  bool bVar21;
  byte bVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  value_type_pointer local_48;
  
  bVar22 = 0;
  local_48 = (this->arrays).elements_;
  if (local_48 != (value_type_pointer)0x0) {
    sVar3 = (this->arrays).groups_size_mask;
    pgVar4 = (this->arrays).groups_;
    if (pgVar4 != pgVar4 + sVar3 + 1) {
      pgVar15 = pgVar4;
      do {
        auVar23[0] = -(pgVar15->m[0].n == '\0');
        auVar23[1] = -(pgVar15->m[1].n == '\0');
        auVar23[2] = -(pgVar15->m[2].n == '\0');
        auVar23[3] = -(pgVar15->m[3].n == '\0');
        auVar23[4] = -(pgVar15->m[4].n == '\0');
        auVar23[5] = -(pgVar15->m[5].n == '\0');
        auVar23[6] = -(pgVar15->m[6].n == '\0');
        auVar23[7] = -(pgVar15->m[7].n == '\0');
        auVar23[8] = -(pgVar15->m[8].n == '\0');
        auVar23[9] = -(pgVar15->m[9].n == '\0');
        auVar23[10] = -(pgVar15->m[10].n == '\0');
        auVar23[0xb] = -(pgVar15->m[0xb].n == '\0');
        auVar23[0xc] = -(pgVar15->m[0xc].n == '\0');
        auVar23[0xd] = -(pgVar15->m[0xd].n == '\0');
        auVar23[0xe] = -(pgVar15->m[0xe].n == '\0');
        auVar23[0xf] = -(pgVar15->m[0xf].n == '\0');
        for (uVar20 = ((uint)(pgVar4 + sVar3 != pgVar15) << 0xe | 0x3fff) &
                      ~(uint)(ushort)((ushort)(SUB161(auVar23 >> 7,0) & 1) |
                                      (ushort)(SUB161(auVar23 >> 0xf,0) & 1) << 1 |
                                      (ushort)(SUB161(auVar23 >> 0x17,0) & 1) << 2 |
                                      (ushort)(SUB161(auVar23 >> 0x1f,0) & 1) << 3 |
                                      (ushort)(SUB161(auVar23 >> 0x27,0) & 1) << 4 |
                                      (ushort)(SUB161(auVar23 >> 0x2f,0) & 1) << 5 |
                                      (ushort)(SUB161(auVar23 >> 0x37,0) & 1) << 6 |
                                      (ushort)(SUB161(auVar23 >> 0x3f,0) & 1) << 7 |
                                      (ushort)(SUB161(auVar23 >> 0x47,0) & 1) << 8 |
                                      (ushort)(SUB161(auVar23 >> 0x4f,0) & 1) << 9 |
                                      (ushort)(SUB161(auVar23 >> 0x57,0) & 1) << 10 |
                                      (ushort)(SUB161(auVar23 >> 0x5f,0) & 1) << 0xb |
                                      (ushort)(SUB161(auVar23 >> 0x67,0) & 1) << 0xc |
                                      (ushort)(SUB161(auVar23 >> 0x6f,0) & 1) << 0xd |
                                      (ushort)(SUB161(auVar23 >> 0x77,0) & 1) << 0xe |
                                     (ushort)(auVar23[0xf] >> 7) << 0xf); uVar20 != 0;
            uVar20 = uVar20 - 1 & uVar20) {
          uVar6 = 0;
          if (uVar20 != 0) {
            for (; (uVar20 >> uVar6 & 1) == 0; uVar6 = uVar6 + 1) {
            }
          }
          ppVar11 = local_48 + uVar6;
          uVar12 = slang::hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::
                   operator()((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *)
                              this,&ppVar11->first);
          uVar18 = uVar12 >> ((byte)new_arrays_->groups_size_index & 0x3f);
          lVar19 = 1;
          while( true ) {
            pgVar5 = new_arrays_->groups_;
            pgVar1 = pgVar5 + uVar18;
            auVar24[0] = -(pgVar1->m[0].n == '\0');
            auVar24[1] = -(pgVar1->m[1].n == '\0');
            auVar24[2] = -(pgVar1->m[2].n == '\0');
            auVar24[3] = -(pgVar1->m[3].n == '\0');
            auVar24[4] = -(pgVar1->m[4].n == '\0');
            auVar24[5] = -(pgVar1->m[5].n == '\0');
            auVar24[6] = -(pgVar1->m[6].n == '\0');
            auVar24[7] = -(pgVar1->m[7].n == '\0');
            auVar24[8] = -(pgVar1->m[8].n == '\0');
            auVar24[9] = -(pgVar1->m[9].n == '\0');
            auVar24[10] = -(pgVar1->m[10].n == '\0');
            auVar24[0xb] = -(pgVar1->m[0xb].n == '\0');
            auVar24[0xc] = -(pgVar1->m[0xc].n == '\0');
            auVar24[0xd] = -(pgVar1->m[0xd].n == '\0');
            auVar24[0xe] = -(pgVar1->m[0xe].n == '\0');
            auVar24[0xf] = -(pgVar1->m[0xf].n == '\0');
            uVar8 = (ushort)(SUB161(auVar24 >> 7,0) & 1) |
                    (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                    (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe;
            if (uVar8 == 0) {
              pgVar5[uVar18].m[0xf].n = pgVar5[uVar18].m[0xf].n | '\x01' << ((byte)uVar12 & 7);
            }
            else {
              uVar7 = 0;
              if (uVar8 != 0) {
                for (; (uVar8 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              pcVar9 = (ppVar11->first)._M_str;
              ppVar2 = new_arrays_->elements_ + uVar18 * 0xf + (ulong)uVar7;
              (ppVar2->first)._M_len = (ppVar11->first)._M_len;
              (ppVar2->first)._M_str = pcVar9;
              pPVar16 = &local_48[uVar6].second;
              pPVar17 = &ppVar2->second;
              for (lVar13 = 9; lVar13 != 0; lVar13 = lVar13 + -1) {
                (pPVar17->syntax).ptr = (pPVar16->syntax).ptr;
                pPVar16 = (PortInfo *)((long)pPVar16 + (ulong)bVar22 * -0x10 + 8);
                pPVar17 = (PortInfo *)((long)pPVar17 + (ulong)bVar22 * -0x10 + 8);
              }
              pgVar5[uVar18].m[uVar7].n =
                   *(uchar *)(&group15<boost::unordered::detail::foa::plain_integral>::
                               match_word(unsigned_long)::word + (uVar12 & 0xff));
            }
            if (uVar8 != 0) break;
            uVar18 = uVar18 + lVar19 & new_arrays_->groups_size_mask;
            lVar19 = lVar19 + 1;
          }
        }
        local_48 = local_48 + 0xf;
        bVar21 = pgVar4 + sVar3 != pgVar15;
        pgVar15 = pgVar15 + 1;
      } while (bVar21);
    }
  }
  delete_arrays(this,&this->arrays);
  sVar3 = new_arrays_->groups_size_index;
  sVar10 = new_arrays_->groups_size_mask;
  ppVar11 = new_arrays_->elements_;
  (this->arrays).groups_ = new_arrays_->groups_;
  (this->arrays).elements_ = ppVar11;
  (this->arrays).groups_size_index = sVar3;
  (this->arrays).groups_size_mask = sVar10;
  uVar18 = (this->arrays).groups_size_mask * 0xf + 0xe;
  if ((this->arrays).elements_ == (value_type_pointer)0x0) {
    uVar18 = 0;
  }
  uVar14 = (ulong)((float)uVar18 * 0.875);
  uVar14 = (long)((float)uVar18 * 0.875 - 9.223372e+18) & (long)uVar14 >> 0x3f | uVar14;
  if (uVar18 < 0x1e) {
    uVar14 = uVar18;
  }
  (this->size_ctrl).ml = uVar14;
  return;
}

Assistant:

BOOST_NOINLINE void unchecked_rehash(arrays_type& new_arrays_) {
        std::size_t num_destroyed = 0;
        BOOST_TRY {
            for_all_elements([&, this](element_type* p) {
                nosize_transfer_element(p, new_arrays_, num_destroyed);
            });
        }